

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::TraverseSchema::processAttributeDeclRef
          (TraverseSchema *this,DOMElement *elem,ComplexTypeInfo *typeInfo,XMLCh *refName,
          XMLCh *useAttr,XMLCh *defaultVal,XMLCh *fixedVal)

{
  SchemaInfo **enclosingSchema;
  uint saveScope;
  DefAttTypes defType;
  SchemaInfo *toRestore;
  DatatypeValidator *pDVar1;
  XercesAttGroupInfo *pXVar2;
  QName *pQVar3;
  bool bVar4;
  bool bVar5;
  uint uri;
  int iVar6;
  XMLCh *pXVar7;
  XMLCh *baseName;
  SchemaAttDef *pSVar8;
  DOMElement *elem_00;
  Grammar *pGVar9;
  SchemaInfo *toRestore_00;
  SchemaAttDef *this_00;
  undefined1 *msgDomain;
  byte bVar10;
  ListType LStackY_a0;
  
  if (this->fCurrentAttGroupInfo == (XercesAttGroupInfo *)0x0 && typeInfo == (ComplexTypeInfo *)0x0)
  {
    return;
  }
  pXVar7 = getPrefix(this,refName);
  baseName = getLocalPart(this,refName);
  pXVar7 = resolvePrefixToURI(this,elem,pXVar7);
  uri = (*(this->fURIStringPool->super_XSerializable)._vptr_XSerializable[5])
                  (this->fURIStringPool,pXVar7);
  if (((typeInfo != (ComplexTypeInfo *)0x0) &&
      (pSVar8 = ComplexTypeInfo::getAttDef(typeInfo,baseName,uri), pSVar8 != (SchemaAttDef *)0x0))
     || ((this->fCurrentAttGroupInfo != (XercesAttGroupInfo *)0x0 &&
         (bVar4 = XercesAttGroupInfo::containsAttribute(this->fCurrentAttGroupInfo,baseName,uri),
         bVar4)))) {
    msgDomain = XMLUni::fgXMLErrDomain;
    iVar6 = 0x46;
    goto LAB_0031a74a;
  }
  enclosingSchema = &this->fSchemaInfo;
  toRestore = this->fSchemaInfo;
  saveScope = this->fCurrentScope;
  bVar4 = XMLString::equals(pXVar7,this->fTargetNSURIString);
  if (bVar4) {
    LStackY_a0 = INCLUDE;
LAB_0031a578:
    bVar4 = RefHashTableOf<xercesc_4_0::XMLAttDef,_xercesc_4_0::StringHasher>::containsKey
                      (this->fAttributeDeclRegistry,baseName);
    if ((!bVar4) &&
       (elem_00 = SchemaInfo::getTopLevelComponent
                            (*enclosingSchema,3,(XMLCh *)SchemaSymbols::fgELT_ATTRIBUTE,baseName,
                             enclosingSchema), elem_00 != (DOMElement *)0x0)) {
      traverseAttributeDecl(this,elem_00,(ComplexTypeInfo *)0x0,true);
    }
    pSVar8 = (SchemaAttDef *)
             RefHashTableOf<xercesc_4_0::XMLAttDef,_xercesc_4_0::StringHasher>::get
                       (this->fAttributeDeclRegistry,baseName);
LAB_0031a5cc:
    if (*enclosingSchema != toRestore) {
      restoreSchemaInfo(this,toRestore,LStackY_a0,saveScope);
    }
    if (pSVar8 == (SchemaAttDef *)0x0) {
      iVar6 = 0x29;
      goto LAB_0031a724;
    }
    defType = (pSVar8->super_XMLAttDef).fDefaultType;
    pXVar7 = (pSVar8->super_XMLAttDef).fValue;
    bVar10 = 1;
    if ((defType == Fixed) &&
       ((defaultVal != (XMLCh *)0x0 ||
        ((fixedVal != (XMLCh *)0x0 && (bVar4 = XMLString::equals(fixedVal,pXVar7), !bVar4)))))) {
      bVar10 = 0;
      reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x87,refName,(XMLCh *)0x0,
                        (XMLCh *)0x0,(XMLCh *)0x0);
    }
    pDVar1 = pSVar8->fDatatypeValidator;
    if ((pDVar1 == (DatatypeValidator *)0x0) || (pDVar1->fType != ID)) {
LAB_0031a7eb:
      bVar4 = XMLString::equals(useAttr,(XMLCh *)SchemaSymbols::fgATTVAL_REQUIRED);
      bVar5 = XMLString::equals(useAttr,(XMLCh *)SchemaSymbols::fgATTVAL_PROHIBITED);
      pQVar3 = pSVar8->fAttName;
      this_00 = (SchemaAttDef *)XMemory::operator_new(0x68,this->fGrammarPoolMemoryManager);
      SchemaAttDef::SchemaAttDef
                (this_00,pQVar3->fPrefix,pQVar3->fLocalPart,pQVar3->fURIId,pXVar7,
                 (pSVar8->super_XMLAttDef).fType,defType,(XMLCh *)0x0,
                 this->fGrammarPoolMemoryManager);
      this_00->fBaseAttDecl = pSVar8;
      this_00->fPSVIScope = SCP_GLOBAL;
      if (defType == Fixed) {
        if ((bVar10 & bVar4) == 1) {
          (this_00->super_XMLAttDef).fDefaultType = Required_And_Fixed;
        }
      }
      else if (bVar5) {
        (this_00->super_XMLAttDef).fDefaultType = DefAttTypes_Max;
      }
      else {
        if (bVar4) {
          if (fixedVal == (XMLCh *)0x0) {
            (this_00->super_XMLAttDef).fDefaultType = Required;
            if (defaultVal == (XMLCh *)0x0) goto LAB_0031a977;
          }
          else {
            (this_00->super_XMLAttDef).fDefaultType = Required_And_Fixed;
            defaultVal = fixedVal;
          }
        }
        else if (fixedVal == (XMLCh *)0x0) {
          if (defaultVal == (XMLCh *)0x0) goto LAB_0031a977;
          (this_00->super_XMLAttDef).fDefaultType = DefAttTypes_Min;
        }
        else {
          (this_00->super_XMLAttDef).fDefaultType = Fixed;
          defaultVal = fixedVal;
        }
        if (pDVar1 != (DatatypeValidator *)0x0) {
          if (pDVar1->fType == ID) {
            reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x88,refName,(XMLCh *)0x0,
                              (XMLCh *)0x0,(XMLCh *)0x0);
          }
          else {
            (*(pDVar1->super_XSerializable)._vptr_XSerializable[8])
                      (pDVar1,defaultVal,this->fSchemaInfo->fValidationContext,this->fMemoryManager)
            ;
          }
        }
        XMLAttDef::setValue((XMLAttDef *)this_00,defaultVal);
      }
LAB_0031a977:
      this_00->fDatatypeValidator = pDVar1;
      if (typeInfo != (ComplexTypeInfo *)0x0) {
        ComplexTypeInfo::addAttDef(typeInfo,this_00);
      }
      if (this->fCurrentAttGroupInfo == (XercesAttGroupInfo *)0x0) {
        return;
      }
      XercesAttGroupInfo::addAttDef
                (this->fCurrentAttGroupInfo,this_00,typeInfo != (ComplexTypeInfo *)0x0);
      return;
    }
    pXVar2 = this->fCurrentAttGroupInfo;
    if (pXVar2 == (XercesAttGroupInfo *)0x0) {
      if (typeInfo->fAttWithTypeId != true) {
        typeInfo->fAttWithTypeId = true;
        goto LAB_0031a7eb;
      }
      iVar6 = 0x89;
    }
    else {
      if (pXVar2->fTypeWithId != true) {
        pXVar2->fTypeWithId = true;
        goto LAB_0031a7eb;
      }
      iVar6 = 0x8a;
    }
LAB_0031a724:
    msgDomain = XMLUni::fgXMLErrDomain;
    pXVar7 = refName;
  }
  else {
    iVar6 = (*(this->fURIStringPool->super_XSerializable)._vptr_XSerializable[5])
                      (this->fURIStringPool,pXVar7);
    bVar4 = isImportingNS(this,iVar6);
    if (bVar4) {
      pGVar9 = GrammarResolver::getGrammar(this->fGrammarResolver,pXVar7);
      if ((pGVar9 != (Grammar *)0x0) &&
         (iVar6 = (*(pGVar9->super_XSerializable)._vptr_XSerializable[5])(pGVar9), iVar6 == 1)) {
        pSVar8 = (SchemaAttDef *)
                 RefHashTableOf<xercesc_4_0::XMLAttDef,_xercesc_4_0::StringHasher>::get
                           ((RefHashTableOf<xercesc_4_0::XMLAttDef,_xercesc_4_0::StringHasher> *)
                            pGVar9[6].super_XSerializable._vptr_XSerializable,baseName);
        if (pSVar8 != (SchemaAttDef *)0x0) {
          LStackY_a0 = INCLUDE;
          goto LAB_0031a5cc;
        }
        toRestore_00 = SchemaInfo::getImportInfo(*enclosingSchema,uri);
        if ((toRestore_00 != (SchemaInfo *)0x0) && (toRestore_00->fProcessed != true)) {
          LStackY_a0 = IMPORT;
          restoreSchemaInfo(this,toRestore_00,IMPORT,0xfffffffe);
          goto LAB_0031a578;
        }
        iVar6 = 0x29;
        goto LAB_0031a724;
      }
      msgDomain = XMLUni::fgValidityDomain;
      iVar6 = 0x26;
    }
    else {
      msgDomain = XMLUni::fgXMLErrDomain;
      iVar6 = 0x8e;
    }
  }
  baseName = (XMLCh *)0x0;
LAB_0031a74a:
  reportSchemaError(this,elem,(XMLCh *)msgDomain,iVar6,pXVar7,baseName,(XMLCh *)0x0,(XMLCh *)0x0);
  return;
}

Assistant:

void TraverseSchema::processAttributeDeclRef(const DOMElement* const elem,
                                             ComplexTypeInfo* const typeInfo,
                                             const XMLCh* const refName,
                                             const XMLCh* const useAttr,
                                             const XMLCh* const defaultVal,
                                             const XMLCh* const fixedVal) {

    if (!typeInfo && !fCurrentAttGroupInfo) {
        return;
    }

    const XMLCh* prefix = getPrefix(refName);
    const XMLCh* localPart = getLocalPart(refName);
    const XMLCh* uriStr = resolvePrefixToURI(elem, prefix);
    unsigned int attURI = fURIStringPool->addOrFind(uriStr);

    // Check for duplicate references
    if (typeInfo && typeInfo->getAttDef(localPart, attURI)) {

        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::DuplicateRefAttribute, uriStr, localPart);
        return;
    }
    else if (fCurrentAttGroupInfo && fCurrentAttGroupInfo->containsAttribute(localPart, attURI)) {

        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::DuplicateRefAttribute, uriStr, localPart);
        return;
    }

    // check for different namespace
    SchemaInfo* saveInfo = fSchemaInfo;
    SchemaInfo::ListType infoType = SchemaInfo::INCLUDE;
    SchemaAttDef* refAttDef = 0;
    unsigned int saveScope = fCurrentScope;

    if (!XMLString::equals(uriStr, fTargetNSURIString)) {

        // Make sure that we have an explicit import statement.
        // Clause 4 of Schema Representation Constraint:
        // http://www.w3.org/TR/xmlschema-1/#src-resolve
        unsigned int uriId = fURIStringPool->addOrFind(uriStr);

        if (!isImportingNS(uriId)) {

            reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::InvalidNSReference, uriStr);
            return;
        }

        Grammar* grammar = fGrammarResolver->getGrammar(uriStr);

        if (grammar == 0 || grammar->getGrammarType() != Grammar::SchemaGrammarType) {

            reportSchemaError(elem, XMLUni::fgValidityDomain, XMLValid::GrammarNotFound, uriStr);
            return;
        }

        refAttDef = (SchemaAttDef*) ((SchemaGrammar*) grammar)->getAttributeDeclRegistry()->get(localPart);

        if (!refAttDef) {

            SchemaInfo* impInfo = fSchemaInfo->getImportInfo(attURI);

            if (!impInfo || impInfo->getProcessed()) {

                reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::TopLevelAttributeNotFound, refName);
                return;
            }

            infoType = SchemaInfo::IMPORT;
            restoreSchemaInfo(impInfo, infoType);
        }
    }

    // if Global attribute registry does not contain the ref attribute, get
    // the referred attribute declaration and traverse it.
    if (!refAttDef) {

        if (fAttributeDeclRegistry->containsKey(localPart) == false) {

            DOMElement* referredAttribute = fSchemaInfo->getTopLevelComponent(SchemaInfo::C_Attribute,
                SchemaSymbols::fgELT_ATTRIBUTE, localPart, &fSchemaInfo);

            if (referredAttribute != 0) {
                traverseAttributeDecl(referredAttribute, 0, true);
            }
        }

        refAttDef = (SchemaAttDef*) fAttributeDeclRegistry->get(localPart);
    }

    // restore schema information, if necessary
    if (fSchemaInfo != saveInfo) {
        restoreSchemaInfo(saveInfo, infoType, saveScope);
    }

    if (!refAttDef) {

        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::TopLevelAttributeNotFound, refName);
        return;
    }

    XMLAttDef::DefAttTypes refAttDefType = refAttDef->getDefaultType();
    const XMLCh* refAttValue = refAttDef->getValue();
    bool invalidAttUse = false;

    if (refAttDefType == XMLAttDef::Fixed &&
        (defaultVal || (fixedVal && !XMLString::equals(fixedVal, refAttValue)))) {

        invalidAttUse = true;
        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::AttUseCorrect, refName);
    }

    DatatypeValidator* attDV = refAttDef->getDatatypeValidator();

    //check for multiple attributes with type derived from ID
    if (attDV && attDV->getType() == DatatypeValidator::ID) {

        if (fCurrentAttGroupInfo) {

            if (fCurrentAttGroupInfo->containsTypeWithId()) {

                reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::AttGrpPropCorrect3, refName);
                return;
            }

            fCurrentAttGroupInfo->setTypeWithId(true);
        }
        else {

            if (typeInfo->containsAttWithTypeId()) {

                reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::AttDeclPropCorrect5, refName);
                return;
            }

            typeInfo->setAttWithTypeId(true);
        }
    }

    bool required = XMLString::equals(useAttr,SchemaSymbols::fgATTVAL_REQUIRED);
    bool prohibited = XMLString::equals(useAttr,SchemaSymbols::fgATTVAL_PROHIBITED);
    QName* attQName = refAttDef->getAttName();
    SchemaAttDef* attDef = new (fGrammarPoolMemoryManager) SchemaAttDef(attQName->getPrefix(),
                                            attQName->getLocalPart(),
                                            attQName->getURI(),
                                            refAttValue,
                                            refAttDef->getType(),
                                            refAttDefType,
                                            0, fGrammarPoolMemoryManager);

    attDef->setBaseAttDecl(refAttDef);
    attDef->setPSVIScope(PSVIDefs::SCP_GLOBAL);

    if (refAttDefType == XMLAttDef::Fixed) {
        if (required && !invalidAttUse) {
            attDef->setDefaultType(XMLAttDef::Required_And_Fixed);
        }
    }
    else {

        if (prohibited) {
            attDef->setDefaultType(XMLAttDef::Prohibited);
        }
        else {

            const XMLCh* valueConstraint = defaultVal;

            if (required){

                if (fixedVal) {

                    attDef->setDefaultType(XMLAttDef::Required_And_Fixed);
                    valueConstraint = fixedVal;
                }
                else {
                    attDef->setDefaultType(XMLAttDef::Required);
                }
            }
            else
            {
                if (fixedVal) {
                    attDef->setDefaultType(XMLAttDef::Fixed);
                    valueConstraint = fixedVal;
                }
                else if (defaultVal) {
                    attDef->setDefaultType(XMLAttDef::Default);
                }
            }

            if (valueConstraint) {

                // validate content of value constraint
                if (attDV) {

                    if (attDV->getType() == DatatypeValidator::ID) {
                        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::AttDeclPropCorrect3, refName);
                    }
                    else {
                        try {
                            attDV->validate(valueConstraint
                                          , fSchemaInfo->getValidationContext()
                                          , fMemoryManager);
                        }
                        catch(const XMLException& excep) {
                            reportSchemaError(elem, excep);
                        }
                        catch(const OutOfMemoryException&)
                        {
                            throw;
                        }
                        catch (...) {
                            reportSchemaError(elem, XMLUni::fgValidityDomain, XMLValid::DatatypeValidationFailure, valueConstraint);
                        }
                    }
                }

                attDef->setValue(valueConstraint);
            }
        }
    }

    attDef->setDatatypeValidator(attDV);

    bool toClone = false;

    if (typeInfo) {

        toClone = true;
        typeInfo->addAttDef(attDef);
    }

    if (fCurrentAttGroupInfo) {
        fCurrentAttGroupInfo->addAttDef(attDef, toClone);
    }
}